

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O2

void __thiscall QMdiSubWindowPrivate::setNewGeometry(QMdiSubWindowPrivate *this,QPoint *pos)

{
  Operation OVar1;
  undefined4 uVar2;
  QWidget *this_00;
  undefined4 uVar3;
  Representation RVar4;
  uint uVar5;
  uint uVar6;
  Representation RVar7;
  iterator iVar8;
  QSize QVar9;
  Representation RVar11;
  Representation RVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  long in_FS_OFFSET;
  undefined1 auVar21 [16];
  QRect QVar22;
  QRect local_48;
  long local_38;
  QWidgetData *pQVar10;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  iVar8 = QMap<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo>::find
                    (&this->operationMap,&this->currentOperation);
  uVar6 = *(uint *)((long)iVar8.i._M_node + 0x28);
  iVar19 = (pos->xp).m_i;
  iVar15 = (pos->yp).m_i;
  uVar5 = *(uint *)(*(long *)&this_00->field_0x8 + 0x388);
  if ((~uVar5 & 3) == 0) goto LAB_004185f4;
  QVar22 = QWidget::rect(*(QWidget **)(*(long *)&this_00->field_0x8 + 0x10));
  OVar1 = this->currentOperation;
  RVar12 = QVar22.y2.m_i;
  RVar4 = QVar22.y1.m_i;
  iVar14 = iVar15;
  if ((uVar5 & 2) == 0) {
    if ((byte)(OVar1 == Move | (byte)((uVar6 & 0x20) >> 5)) == 1) {
      iVar14 = (this->mousePressPosition).yp.m_i - (this->oldGeometry).y1.m_i;
      iVar13 = (RVar12.m_i - RVar4.m_i) + -4;
      if (iVar14 <= iVar15) {
        iVar14 = iVar15;
      }
      if (iVar13 <= iVar14) {
        iVar14 = iVar13;
      }
      goto LAB_0041854d;
    }
  }
  else {
LAB_0041854d:
    if (OVar1 == Move) {
      if ((uVar5 & 1) == 0) {
        iVar13 = (QVar22.x2.m_i.m_i - QVar22.x1.m_i) + -4;
        iVar15 = 5;
        if (5 < iVar19) {
          iVar15 = iVar19;
        }
        iVar19 = iVar15;
        if (iVar13 <= iVar15) {
          iVar19 = iVar13;
        }
      }
      iVar15 = iVar14;
      if (((uVar5 & 2) == 0) && (iVar15 = (RVar12.m_i - RVar4.m_i) + -4, iVar14 < iVar15)) {
        iVar15 = iVar14;
      }
      goto LAB_004185f4;
    }
  }
  if ((uVar5 & 1) == 0) {
    if ((uVar6 & 0x10) == 0) {
      iVar15 = ((QVar22.x2.m_i.m_i - QVar22.x1.m_i) - (this->oldGeometry).x2.m_i) +
               (this->mousePressPosition).xp.m_i;
      if (iVar15 < iVar19) {
        iVar19 = iVar15;
      }
    }
    else {
      iVar15 = (this->mousePressPosition).xp.m_i - (this->oldGeometry).x1.m_i;
      if (iVar19 < iVar15) {
        iVar19 = iVar15;
      }
    }
  }
  iVar15 = iVar14;
  if (((uVar6 & 0x20) == 0 && (uVar5 & 2) == 0) &&
     (iVar15 = ((RVar12.m_i - RVar4.m_i) - (this->oldGeometry).y2.m_i) +
               (this->mousePressPosition).yp.m_i, iVar14 <= iVar15)) {
    iVar15 = iVar14;
  }
LAB_004185f4:
  if ((uVar6 & 3) == 0) {
    pQVar10 = this_00->data;
    uVar20._0_4_ = (pQVar10->crect).x1;
    uVar20._4_4_ = (pQVar10->crect).y1;
    iVar14 = uVar20._4_4_;
  }
  else {
    iVar16 = iVar19 - (this->mousePressPosition).xp.m_i;
    iVar13 = ((this->oldGeometry).x2.m_i - (this->oldGeometry).x1.m_i) + 1;
    iVar17 = iVar13 - (this->internalMinimumSize).wd.m_i;
    QVar9 = QWidget::maximumSize(this_00);
    iVar14 = 0;
    if ((uVar6 & 1) != 0) {
      iVar14 = iVar16;
      if (iVar16 < 1) {
        if (((uVar6 & 4) != 0) && (iVar14 = iVar13 - QVar9.wd.m_i, iVar14 < iVar16)) {
          iVar14 = iVar16;
        }
      }
      else if (((uVar6 & 4) != 0) && (iVar14 = iVar17, iVar16 < iVar17)) {
        iVar14 = iVar16;
      }
    }
    iVar17 = iVar15 - (this->mousePressPosition).yp.m_i;
    iVar16 = ((this->oldGeometry).y2.m_i - (this->oldGeometry).y1.m_i) + 1;
    iVar18 = iVar16 - (this->internalMinimumSize).ht.m_i;
    uVar5 = QWidget::maximumHeight(this_00);
    pQVar10 = (QWidgetData *)(ulong)uVar5;
    iVar13 = 0;
    if ((uVar6 & 2) != 0) {
      iVar13 = iVar17;
      if (iVar17 < 1) {
        if (((uVar6 & 8) != 0) && (iVar13 = iVar16 - uVar5, iVar13 < iVar17)) {
          iVar13 = iVar17;
        }
      }
      else if (((uVar6 & 8) != 0) && (iVar13 = iVar18, iVar17 < iVar18)) {
        iVar13 = iVar17;
      }
    }
    uVar2 = (this->oldGeometry).x1;
    uVar3 = (this->oldGeometry).y1;
    uVar20 = (ulong)(uint)(iVar14 + uVar2);
    iVar14 = uVar3 + iVar13;
  }
  iVar13 = (int)uVar20;
  local_48.x1.m_i = iVar13;
  local_48.y1.m_i = iVar14;
  if ((uVar6 & 0xc) == 0) {
    QVar9 = QRect::size(&this_00->data->crect);
    RVar11 = QVar9.wd.m_i;
    RVar7 = QVar9.ht.m_i;
  }
  else {
    iVar19 = iVar19 - (this->mousePressPosition).xp.m_i;
    iVar15 = iVar15 - (this->mousePressPosition).yp.m_i;
    auVar21._0_4_ = -(uint)((uVar6 & 0x20) == 0);
    auVar21._4_4_ = -(uint)((uVar6 & 8) == 0);
    auVar21._8_4_ = -(uint)((uVar6 & 0x10) == 0);
    auVar21._12_4_ = -(uint)((uVar6 & 4) == 0);
    uVar6 = movmskps((int)pQVar10,auVar21);
    iVar16 = -iVar19;
    if ((uVar6 & 4) != 0) {
      iVar16 = iVar19;
    }
    if ((uVar6 & 8) != 0) {
      iVar16 = 0;
    }
    iVar19 = -iVar15;
    if ((uVar6 & 1) != 0) {
      iVar19 = iVar15;
    }
    if ((uVar6 & 2) != 0) {
      iVar19 = 0;
    }
    QVar9 = QRect::size(&this->oldGeometry);
    RVar11.m_i = QVar9.wd.m_i.m_i + iVar16;
    RVar7.m_i = QVar9.ht.m_i.m_i + iVar19;
  }
  local_48.y2.m_i = RVar7.m_i + -1 + iVar14;
  local_48.x2.m_i = RVar11.m_i + -1 + iVar13;
  setNewGeometry(this,&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMdiSubWindowPrivate::setNewGeometry(const QPoint &pos)
{
    Q_Q(QMdiSubWindow);
    Q_ASSERT(currentOperation != None);
    Q_ASSERT(parent);

    uint cflags = operationMap.find(currentOperation).value().changeFlags;
    int posX = pos.x();
    int posY = pos.y();

    const bool restrictHorizontal = !q->testOption(QMdiSubWindow::AllowOutsideAreaHorizontally);
    const bool restrictVertical = !q->testOption(QMdiSubWindow::AllowOutsideAreaVertically);

    if (restrictHorizontal || restrictVertical) {
        QRect parentRect = q->parentWidget()->rect();
        if (restrictVertical && (cflags & VResizeReverse || currentOperation == Move)) {
            posY = qMin(qMax(mousePressPosition.y() - oldGeometry.y(), posY),
                        parentRect.height() - BoundaryMargin);
        }
        if (currentOperation == Move) {
            if (restrictHorizontal)
                posX = qMin(qMax(BoundaryMargin, posX), parentRect.width() - BoundaryMargin);
            if (restrictVertical)
                posY = qMin(posY, parentRect.height() - BoundaryMargin);
        } else {
            if (restrictHorizontal) {
                if (cflags & HResizeReverse)
                    posX = qMax(mousePressPosition.x() - oldGeometry.x(), posX);
                else
                    posX = qMin(parentRect.width() - (oldGeometry.x() + oldGeometry.width()
                                                      - mousePressPosition.x()), posX);
            }
            if (restrictVertical && !(cflags & VResizeReverse)) {
                posY = qMin(parentRect.height() - (oldGeometry.y() + oldGeometry.height()
                                                   - mousePressPosition.y()), posY);
            }
        }
    }

    QRect geometry;
    if (cflags & (HMove | VMove)) {
        int dx = getMoveDeltaComponent(cflags, HMove, HResize, posX - mousePressPosition.x(),
                                       oldGeometry.width() - internalMinimumSize.width(),
                                       oldGeometry.width() - q->maximumWidth());
        int dy = getMoveDeltaComponent(cflags, VMove, VResize, posY - mousePressPosition.y(),
                                       oldGeometry.height() - internalMinimumSize.height(),
                                       oldGeometry.height() - q->maximumHeight());
        geometry.setTopLeft(oldGeometry.topLeft() + QPoint(dx, dy));
    } else {
        geometry.setTopLeft(q->geometry().topLeft());
    }

    if (cflags & (HResize | VResize)) {
        int dx = getResizeDeltaComponent(cflags, HResize, HResizeReverse,
                                         posX - mousePressPosition.x());
        int dy = getResizeDeltaComponent(cflags, VResize, VResizeReverse,
                                         posY - mousePressPosition.y());
        geometry.setSize(oldGeometry.size() + QSize(dx, dy));
    } else {
        geometry.setSize(q->geometry().size());
    }

    setNewGeometry(&geometry);
}